

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::GenerateRustModuleRootFile(flatbuffers::Parser_const&,std::__cxx11::string_const&)::
Module::GenerateImports(flatbuffers::CodeWriter__(void *this,CodeWriter *code)

{
  _Rb_tree_node_base *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (p_Var1 = *(_Rb_tree_node_base **)((long)this + 0x18);
      p_Var1 != (_Rb_tree_node_base *)((long)this + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    std::operator+(&local_f0,"pub mod ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1)
                  );
    std::operator+(&local_50,&local_f0," {");
    CodeWriter::operator+=(code,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_f0);
    code->cur_ident_lvl_ = code->cur_ident_lvl_ + 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"use super::*;",(allocator<char> *)&local_f0);
    CodeWriter::operator+=(code,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    CodeWriter__(p_Var1 + 2,code);
    if (code->cur_ident_lvl_ != 0) {
      code->cur_ident_lvl_ = code->cur_ident_lvl_ + -1;
    }
    std::operator+(&local_90,"} // ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1)
                  );
    CodeWriter::operator+=(code,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  for (__rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                ((long)this + 0x30);
      __rhs != *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                ((long)this + 0x38); __rhs = __rhs + 1) {
    std::operator+(&local_f0,"mod ",__rhs);
    std::operator+(&local_b0,&local_f0,";");
    CodeWriter::operator+=(code,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::operator+(&local_f0,"pub use self::",__rhs);
    std::operator+(&local_d0,&local_f0,"::*;");
    CodeWriter::operator+=(code,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  return;
}

Assistant:

void GenerateImports(CodeWriter &code) {
      for (auto it = sub_modules.begin(); it != sub_modules.end(); it++) {
        code += "pub mod " + it->first + " {";
        code.IncrementIdentLevel();
        code += "use super::*;";
        it->second.GenerateImports(code);
        code.DecrementIdentLevel();
        code += "} // " + it->first;
      }
      for (auto it = generated_files.begin(); it != generated_files.end();
           it++) {
        code += "mod " + *it + ";";
        code += "pub use self::" + *it + "::*;";
      }
    }